

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_graph_utilities.cpp
# Opt level: O2

void __thiscall
test_graph_utilities_eccentricity_vertex_breadth_first_Test::
~test_graph_utilities_eccentricity_vertex_breadth_first_Test
          (test_graph_utilities_eccentricity_vertex_breadth_first_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(test_graph_utilities, eccentricity_vertex_breadth_first) {

  // Perform a test on a graph, and starting at 0.
  Adjacency_Graph graph = create_graph_structured<false>(5);
  std::vector<std::size_t> distances;
  eccentricity_vertex_breadth_first(graph, 0, distances);
  std::vector<std::size_t> hand_computed_answer(
  {0, 1, 2, 3, 4, 1, 2, 3, 4, 5, 2, 3, 4, 5, 6, 3, 4, 5, 6, 7, 4, 5, 6, 7, 8});
  EXPECT_EQ(distances, hand_computed_answer);

  // Perform a test on a subgraph, capping the max vertex, and starting at a different vertex to the above.
  Adjacency_Subgraph subgraph(
  graph, {0, 1, 2, 3, 4, 5, 6, 7, 8, 9, 10, 11, 12, 13, 14, 15, 16, 17, 18, 19, 20, 21, 22, 23, 24});
  eccentricity_vertex_breadth_first(graph, 12, distances, 15);
  hand_computed_answer = std::vector<std::size_t>({4, 3, 2, 3, 4, 3, 2, 1, 2, 3, 2, 1, 0, 1, 2});
  EXPECT_EQ(distances, hand_computed_answer);

  // Death test.
  EXPECT_DEATH(eccentricity_vertex_breadth_first(Adjacency_Graph<false>(), 0, distances), "./*");
  EXPECT_DEATH(eccentricity_vertex_breadth_first(subgraph, 1500, distances), "./*");
  EXPECT_DEATH(eccentricity_vertex_breadth_first(subgraph, 2, distances, 900), "./*");
  EXPECT_DEATH(eccentricity_vertex_breadth_first(subgraph, 10, distances, 1), "./*");
}